

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

type * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::book3b>
          (type *__return_storage_ptr__,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  double dVar1;
  bool bVar2;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *pbVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  type *ptVar4;
  type *extraout_RAX;
  system_error *this_01;
  error_code __ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  allocator<char> local_51;
  undefined1 local_50 [32];
  string_view_type local_30;
  undefined7 extraout_var;
  
  bVar2 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::book3b,_void>
          ::is(this);
  if (bVar2) {
    (__return_storage_ptr__->author_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->author_).field_2;
    (__return_storage_ptr__->author_)._M_string_length = 0;
    (__return_storage_ptr__->author_).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->title_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->title_).field_2;
    (__return_storage_ptr__->title_)._M_string_length = 0;
    (__return_storage_ptr__->title_).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->price_ = 0.0;
    (__return_storage_ptr__->isbn_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->isbn_).field_2;
    (__return_storage_ptr__->isbn_)._M_string_length = 0;
    (__return_storage_ptr__->isbn_).field_2._M_local_buf[0] = '\0';
    local_50._0_8_ = &DAT_00000006;
    local_50._8_8_ = "Author";
    bVar2 = contains(this,(string_view_type *)local_50);
    if (bVar2) {
      local_30._M_len = 6;
      local_30._M_str = "Author";
      pbVar3 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)at(this,&local_30);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 pbVar3,&local_51);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
    }
    local_50._0_8_ = &DAT_00000005;
    local_50._8_8_ = "Title";
    bVar2 = contains(this,(string_view_type *)local_50);
    if (bVar2) {
      local_30._M_len = 5;
      local_30._M_str = "Title";
      pbVar3 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)at(this,&local_30);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 pbVar3,&local_51);
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->title_);
      if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
    }
    local_50._0_8_ = &DAT_00000005;
    local_50._8_8_ = "Price";
    bVar2 = contains(this,(string_view_type *)local_50);
    if (bVar2) {
      local_50._0_8_ = &DAT_00000005;
      local_50._8_8_ = "Price";
      this_00 = at(this,(string_view_type *)local_50);
      dVar1 = as_double(this_00);
      __return_storage_ptr__->price_ = dVar1;
    }
    local_50._0_8_ = (type *)0x4;
    local_50._8_8_ = "Isbn";
    bVar2 = contains(this,(string_view_type *)local_50);
    ptVar4 = (type *)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      local_30._M_len = 4;
      local_30._M_str = "Isbn";
      pbVar3 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)at(this,&local_30);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 pbVar3,&local_51);
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->isbn_);
      ptVar4 = (type *)(local_50 + 0x10);
      if ((type *)local_50._0_8_ != ptVar4) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
        ptVar4 = extraout_RAX;
      }
    }
    return ptVar4;
  }
  this_01 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_30,conversion_failed);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Not a ns::book3b","");
  __ec._0_8_ = local_30._M_len & 0xffffffff;
  *(undefined ***)(this_01 + 0x50) = &PTR__json_exception_00b2f248;
  __ec._M_cat = (error_category *)local_30._M_str;
  std::system_error::system_error(this_01,__ec,(string *)local_50);
  *(undefined8 *)this_01 = 0xb31b78;
  *(undefined8 *)(this_01 + 0x50) = 0xb31bb0;
  *(undefined8 *)(this_01 + 0x20) = 0;
  *(undefined8 *)(this_01 + 0x28) = 0;
  *(system_error **)(this_01 + 0x30) = this_01 + 0x40;
  *(undefined8 *)(this_01 + 0x38) = 0;
  this_01[0x40] = (system_error)0x0;
  __cxa_throw(this_01,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }